

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>_>_>
  *this_00;
  trust_token_method_st **__args_1;
  __tuple_element_t<1UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>_>_>
  *this_01;
  shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>_> local_20;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *local_10;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  local_10 = this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    this_00 = std::
              get<0ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
                        (&this->current_);
    __args_1 = ParamIterator<const_trust_token_method_st_*>::operator*(this_00);
    this_01 = std::
              get<1ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
                        (&this->current_);
    ParamIterator<bool>::operator*(this_01);
    std::
    make_shared<std::tuple<trust_token_method_st_const*,bool>,trust_token_method_st_const*const&,bool_const&>
              ((trust_token_method_st **)&local_20,(bool *)__args_1);
    std::shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>_>::operator=
              (&this->current_value_,&local_20);
    std::shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>_>::~shared_ptr(&local_20);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }